

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_HistoryRecord::SetPointValues(ON_HistoryRecord *this,int value_id,int count,ON_3dPoint *P)

{
  ON_Value *pOVar1;
  
  pOVar1 = FindValueHelper(this,value_id,5,true);
  if (pOVar1 != (ON_Value *)0x0) {
    if (-1 < *(int *)((long)&pOVar1[2]._vptr_ON_Value + 4)) {
      *(undefined4 *)&pOVar1[2]._vptr_ON_Value = 0;
    }
    ON_SimpleArray<ON_3dPoint>::SetCapacity((ON_SimpleArray<ON_3dPoint> *)(pOVar1 + 1),(long)count);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)(pOVar1 + 1),count,P);
  }
  return pOVar1 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetPointValues( int value_id, int count, const ON_3dPoint* P)
{
  ON_PointValue* v = static_cast<ON_PointValue*>(FindValueHelper(value_id,ON_Value::point_value,true));
  if ( v )
  {
    v->m_value.SetCount(0);
    v->m_value.SetCapacity(count);
    v->m_value.Append(count,P);
  }
  return (0 != v);
}